

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutExperimental.hpp
# Opt level: O1

void __thiscall LayoutExperimental::~LayoutExperimental(LayoutExperimental *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->m_right2).name._M_dataplus._M_p;
  paVar1 = &(this->m_right2).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_right1).name._M_dataplus._M_p;
  paVar1 = &(this->m_right1).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_leftColumn).name._M_dataplus._M_p;
  paVar1 = &(this->m_leftColumn).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  GUILayout::~GUILayout(&this->super_GUILayout);
  operator_delete(this,0xf0);
  return;
}

Assistant:

virtual const char* name() const override { return "experimental"; }